

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_mem.hpp
# Opt level: O3

void duckdb::FastMemset(void *ptr,int value,size_t size)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  undefined1 uVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  
  uVar4 = (undefined1)value;
  uVar63 = (undefined1)((uint)value >> 8);
  uVar64 = (undefined1)((uint)value >> 0x10);
  uVar65 = (undefined1)((uint)value >> 0x18);
  uVar1 = (ushort)value;
  switch(size) {
  case 0:
    return;
  case 1:
    *(undefined1 *)ptr = uVar4;
    return;
  case 2:
    goto switchD_005681f0_caseD_2;
  case 3:
    *(undefined1 *)((long)ptr + 2) = uVar4;
switchD_005681f0_caseD_2:
    *(ushort *)ptr = uVar1 & 0xff | (ushort)(value << 8);
    return;
  case 4:
    iVar2 = (value & 0xffU) * 0x1010101;
    goto LAB_00568293;
  case 5:
    iVar2 = (value & 0xffU) * 0x1010101;
    *(int *)ptr = iVar2;
    *(char *)((long)ptr + 4) = (char)iVar2;
    return;
  case 6:
    iVar2 = (value & 0xffU) * 0x1010101;
    *(int *)ptr = iVar2;
    *(short *)((long)ptr + 4) = (short)iVar2;
    return;
  case 7:
    iVar2 = (value & 0xffU) * 0x1010101;
    *(int *)((long)ptr + 3) = iVar2;
LAB_00568293:
    *(int *)ptr = iVar2;
    return;
  case 8:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    goto LAB_005692c9;
  case 9:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)ptr = lVar3;
    *(char *)((long)ptr + 8) = (char)lVar3;
    return;
  case 10:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)ptr = lVar3;
    *(short *)((long)ptr + 8) = (short)lVar3;
    return;
  case 0xb:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)ptr = lVar3;
    *(int *)((long)ptr + 7) = (int)lVar3;
    return;
  case 0xc:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)ptr = lVar3;
    *(int *)((long)ptr + 8) = (int)lVar3;
    return;
  case 0xd:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)((long)ptr + 5) = lVar3;
    goto LAB_005692c9;
  case 0xe:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)((long)ptr + 6) = lVar3;
    goto LAB_005692c9;
  case 0xf:
    lVar3 = (ulong)(value & 0xff) * 0x101010101010101;
    *(long *)((long)ptr + 7) = lVar3;
LAB_005692c9:
    *(long *)ptr = lVar3;
    return;
  case 0x10:
    break;
  case 0x11:
    *(undefined1 *)((long)ptr + 0x10) = uVar4;
    break;
  case 0x12:
    *(ushort *)((long)ptr + 0x10) = uVar1 & 0xff | (ushort)(value << 8);
    break;
  case 0x13:
    *(uint *)((long)ptr + 0xf) = (value & 0xffU) * 0x1010101;
    break;
  case 0x14:
    *(uint *)((long)ptr + 0x10) = (value & 0xffU) * 0x1010101;
    break;
  case 0x15:
    *(ulong *)((long)ptr + 0xd) = (ulong)(value & 0xff) * 0x101010101010101;
    break;
  case 0x16:
    *(ulong *)((long)ptr + 0xe) = (ulong)(value & 0xff) * 0x101010101010101;
    break;
  case 0x17:
    *(ulong *)((long)ptr + 0xf) = (ulong)(value & 0xff) * 0x101010101010101;
    break;
  case 0x18:
    *(ulong *)((long)ptr + 0x10) = (ulong)(value & 0xff) * 0x101010101010101;
    break;
  case 0x19:
    auVar35._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar35[3] = uVar63;
    auVar35[2] = uVar63;
    auVar35[1] = uVar4;
    auVar35[0] = uVar4;
    auVar35._8_8_ = 0;
    auVar37 = pshuflw(auVar35,auVar35,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 9) = uVar5;
    *(undefined4 *)((long)ptr + 0xd) = uVar5;
    *(undefined4 *)((long)ptr + 0x11) = uVar5;
    *(undefined4 *)((long)ptr + 0x15) = uVar5;
    goto LAB_0056917a;
  case 0x1a:
    auVar31._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar31[3] = uVar63;
    auVar31[2] = uVar63;
    auVar31[1] = uVar4;
    auVar31[0] = uVar4;
    auVar31._8_8_ = 0;
    auVar37 = pshuflw(auVar31,auVar31,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 10) = uVar5;
    *(undefined4 *)((long)ptr + 0xe) = uVar5;
    *(undefined4 *)((long)ptr + 0x12) = uVar5;
    *(undefined4 *)((long)ptr + 0x16) = uVar5;
    goto LAB_0056917a;
  case 0x1b:
    auVar61._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar61[3] = uVar63;
    auVar61[2] = uVar63;
    auVar61[1] = uVar4;
    auVar61[0] = uVar4;
    auVar61._8_8_ = 0;
    auVar37 = pshuflw(auVar61,auVar61,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0xb) = uVar5;
    *(undefined4 *)((long)ptr + 0xf) = uVar5;
    *(undefined4 *)((long)ptr + 0x13) = uVar5;
    *(undefined4 *)((long)ptr + 0x17) = uVar5;
    goto LAB_0056917a;
  case 0x1c:
    auVar19._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar19[3] = uVar63;
    auVar19[2] = uVar63;
    auVar19[1] = uVar4;
    auVar19[0] = uVar4;
    auVar19._8_8_ = 0;
    auVar37 = pshuflw(auVar19,auVar19,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0xc) = uVar5;
    *(undefined4 *)((long)ptr + 0x10) = uVar5;
    *(undefined4 *)((long)ptr + 0x14) = uVar5;
    *(undefined4 *)((long)ptr + 0x18) = uVar5;
    goto LAB_0056917a;
  case 0x1d:
    auVar23._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar23[3] = uVar63;
    auVar23[2] = uVar63;
    auVar23[1] = uVar4;
    auVar23[0] = uVar4;
    auVar23._8_8_ = 0;
    auVar37 = pshuflw(auVar23,auVar23,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0xd) = uVar5;
    *(undefined4 *)((long)ptr + 0x11) = uVar5;
    *(undefined4 *)((long)ptr + 0x15) = uVar5;
    *(undefined4 *)((long)ptr + 0x19) = uVar5;
    goto LAB_0056917a;
  case 0x1e:
    auVar59._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar59[3] = uVar63;
    auVar59[2] = uVar63;
    auVar59[1] = uVar4;
    auVar59[0] = uVar4;
    auVar59._8_8_ = 0;
    auVar37 = pshuflw(auVar59,auVar59,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0xe) = uVar5;
    *(undefined4 *)((long)ptr + 0x12) = uVar5;
    *(undefined4 *)((long)ptr + 0x16) = uVar5;
    *(undefined4 *)((long)ptr + 0x1a) = uVar5;
    goto LAB_0056917a;
  case 0x1f:
    auVar34._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar34[3] = uVar63;
    auVar34[2] = uVar63;
    auVar34[1] = uVar4;
    auVar34[0] = uVar4;
    auVar34._8_8_ = 0;
    auVar37 = pshuflw(auVar34,auVar34,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0xf) = uVar5;
    *(undefined4 *)((long)ptr + 0x13) = uVar5;
    *(undefined4 *)((long)ptr + 0x17) = uVar5;
    *(undefined4 *)((long)ptr + 0x1b) = uVar5;
    goto LAB_0056917a;
  case 0x20:
    goto switchD_005681f0_caseD_20;
  case 0x21:
    *(undefined1 *)((long)ptr + 0x20) = uVar4;
    goto switchD_005681f0_caseD_20;
  case 0x22:
    *(ushort *)((long)ptr + 0x20) = uVar1 & 0xff | (ushort)(value << 8);
    goto switchD_005681f0_caseD_20;
  case 0x23:
    *(uint *)((long)ptr + 0x1f) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_20;
  case 0x24:
    *(uint *)((long)ptr + 0x20) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_20;
  case 0x25:
    *(ulong *)((long)ptr + 0x1d) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_20;
  case 0x26:
    *(ulong *)((long)ptr + 0x1e) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_20;
  case 0x27:
    *(ulong *)((long)ptr + 0x1f) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_20;
  case 0x28:
    *(ulong *)((long)ptr + 0x20) = (ulong)(value & 0xff) * 0x101010101010101;
switchD_005681f0_caseD_20:
    auVar60._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar60[3] = uVar63;
    auVar60[2] = uVar63;
    auVar60[1] = uVar4;
    auVar60[0] = uVar4;
    auVar60._8_8_ = 0;
    auVar37 = pshuflw(auVar60,auVar60,0);
    uVar5 = auVar37._0_4_;
LAB_00569175:
    *(undefined4 *)((long)ptr + 0x10) = uVar5;
    *(undefined4 *)((long)ptr + 0x14) = uVar5;
    *(undefined4 *)((long)ptr + 0x18) = uVar5;
    *(undefined4 *)((long)ptr + 0x1c) = uVar5;
    goto LAB_0056917a;
  case 0x29:
    auVar24._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar24[3] = uVar63;
    auVar24[2] = uVar63;
    auVar24[1] = uVar4;
    auVar24[0] = uVar4;
    auVar24._8_8_ = 0;
    auVar37 = pshuflw(auVar24,auVar24,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x19) = uVar5;
    *(undefined4 *)((long)ptr + 0x1d) = uVar5;
    *(undefined4 *)((long)ptr + 0x21) = uVar5;
    *(undefined4 *)((long)ptr + 0x25) = uVar5;
    goto LAB_00569175;
  case 0x2a:
    auVar36._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar36[3] = uVar63;
    auVar36[2] = uVar63;
    auVar36[1] = uVar4;
    auVar36[0] = uVar4;
    auVar36._8_8_ = 0;
    auVar37 = pshuflw(auVar36,auVar36,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x1a) = uVar5;
    *(undefined4 *)((long)ptr + 0x1e) = uVar5;
    *(undefined4 *)((long)ptr + 0x22) = uVar5;
    *(undefined4 *)((long)ptr + 0x26) = uVar5;
    goto LAB_00569175;
  case 0x2b:
    auVar53._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar53[3] = uVar63;
    auVar53[2] = uVar63;
    auVar53[1] = uVar4;
    auVar53[0] = uVar4;
    auVar53._8_8_ = 0;
    auVar37 = pshuflw(auVar53,auVar53,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x1b) = uVar5;
    *(undefined4 *)((long)ptr + 0x1f) = uVar5;
    *(undefined4 *)((long)ptr + 0x23) = uVar5;
    *(undefined4 *)((long)ptr + 0x27) = uVar5;
    goto LAB_00569175;
  case 0x2c:
    auVar21._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar21[3] = uVar63;
    auVar21[2] = uVar63;
    auVar21[1] = uVar4;
    auVar21[0] = uVar4;
    auVar21._8_8_ = 0;
    auVar37 = pshuflw(auVar21,auVar21,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x1c) = uVar5;
    *(undefined4 *)((long)ptr + 0x20) = uVar5;
    *(undefined4 *)((long)ptr + 0x24) = uVar5;
    *(undefined4 *)((long)ptr + 0x28) = uVar5;
    goto LAB_00569175;
  case 0x2d:
    auVar20._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar20[3] = uVar63;
    auVar20[2] = uVar63;
    auVar20[1] = uVar4;
    auVar20[0] = uVar4;
    auVar20._8_8_ = 0;
    auVar37 = pshuflw(auVar20,auVar20,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x1d) = uVar5;
    *(undefined4 *)((long)ptr + 0x21) = uVar5;
    *(undefined4 *)((long)ptr + 0x25) = uVar5;
    *(undefined4 *)((long)ptr + 0x29) = uVar5;
    goto LAB_00569175;
  case 0x2e:
    auVar8._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value))
                        >> 0x20);
    auVar8[3] = uVar63;
    auVar8[2] = uVar63;
    auVar8[1] = uVar4;
    auVar8[0] = uVar4;
    auVar8._8_8_ = 0;
    auVar37 = pshuflw(auVar8,auVar8,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x1e) = uVar5;
    *(undefined4 *)((long)ptr + 0x22) = uVar5;
    *(undefined4 *)((long)ptr + 0x26) = uVar5;
    *(undefined4 *)((long)ptr + 0x2a) = uVar5;
    goto LAB_00569175;
  case 0x2f:
    auVar7._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value))
                        >> 0x20);
    auVar7[3] = uVar63;
    auVar7[2] = uVar63;
    auVar7[1] = uVar4;
    auVar7[0] = uVar4;
    auVar7._8_8_ = 0;
    auVar37 = pshuflw(auVar7,auVar7,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x1f) = uVar5;
    *(undefined4 *)((long)ptr + 0x23) = uVar5;
    *(undefined4 *)((long)ptr + 0x27) = uVar5;
    *(undefined4 *)((long)ptr + 0x2b) = uVar5;
    goto LAB_00569175;
  case 0x30:
    goto switchD_005681f0_caseD_30;
  case 0x31:
    *(undefined1 *)((long)ptr + 0x30) = uVar4;
    goto switchD_005681f0_caseD_30;
  case 0x32:
    *(ushort *)((long)ptr + 0x30) = uVar1 & 0xff | (ushort)(value << 8);
    goto switchD_005681f0_caseD_30;
  case 0x33:
    *(uint *)((long)ptr + 0x2f) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_30;
  case 0x34:
    *(uint *)((long)ptr + 0x30) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_30;
  case 0x35:
    *(ulong *)((long)ptr + 0x2d) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_30;
  case 0x36:
    *(ulong *)((long)ptr + 0x2e) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_30;
  case 0x37:
    *(ulong *)((long)ptr + 0x2f) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_30;
  case 0x38:
    *(ulong *)((long)ptr + 0x30) = (ulong)(value & 0xff) * 0x101010101010101;
switchD_005681f0_caseD_30:
    auVar47._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar47[3] = uVar63;
    auVar47[2] = uVar63;
    auVar47[1] = uVar4;
    auVar47[0] = uVar4;
    auVar47._8_8_ = 0;
    auVar37 = pshuflw(auVar47,auVar47,0);
    uVar5 = auVar37._0_4_;
LAB_00569170:
    *(undefined4 *)((long)ptr + 0x20) = uVar5;
    *(undefined4 *)((long)ptr + 0x24) = uVar5;
    *(undefined4 *)((long)ptr + 0x28) = uVar5;
    *(undefined4 *)((long)ptr + 0x2c) = uVar5;
    goto LAB_00569175;
  case 0x39:
    auVar44._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar44[3] = uVar63;
    auVar44[2] = uVar63;
    auVar44[1] = uVar4;
    auVar44[0] = uVar4;
    auVar44._8_8_ = 0;
    auVar37 = pshuflw(auVar44,auVar44,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x29) = uVar5;
    *(undefined4 *)((long)ptr + 0x2d) = uVar5;
    *(undefined4 *)((long)ptr + 0x31) = uVar5;
    *(undefined4 *)((long)ptr + 0x35) = uVar5;
    goto LAB_00569170;
  case 0x3a:
    auVar39._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar39[3] = uVar63;
    auVar39[2] = uVar63;
    auVar39[1] = uVar4;
    auVar39[0] = uVar4;
    auVar39._8_8_ = 0;
    auVar37 = pshuflw(auVar39,auVar39,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x2a) = uVar5;
    *(undefined4 *)((long)ptr + 0x2e) = uVar5;
    *(undefined4 *)((long)ptr + 0x32) = uVar5;
    *(undefined4 *)((long)ptr + 0x36) = uVar5;
    goto LAB_00569170;
  case 0x3b:
    auVar32._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar32[3] = uVar63;
    auVar32[2] = uVar63;
    auVar32[1] = uVar4;
    auVar32[0] = uVar4;
    auVar32._8_8_ = 0;
    auVar37 = pshuflw(auVar32,auVar32,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x2b) = uVar5;
    *(undefined4 *)((long)ptr + 0x2f) = uVar5;
    *(undefined4 *)((long)ptr + 0x33) = uVar5;
    *(undefined4 *)((long)ptr + 0x37) = uVar5;
    goto LAB_00569170;
  case 0x3c:
    auVar42._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar42[3] = uVar63;
    auVar42[2] = uVar63;
    auVar42[1] = uVar4;
    auVar42[0] = uVar4;
    auVar42._8_8_ = 0;
    auVar37 = pshuflw(auVar42,auVar42,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x2c) = uVar5;
    *(undefined4 *)((long)ptr + 0x30) = uVar5;
    *(undefined4 *)((long)ptr + 0x34) = uVar5;
    *(undefined4 *)((long)ptr + 0x38) = uVar5;
    goto LAB_00569170;
  case 0x3d:
    auVar41._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar41[3] = uVar63;
    auVar41[2] = uVar63;
    auVar41[1] = uVar4;
    auVar41[0] = uVar4;
    auVar41._8_8_ = 0;
    auVar37 = pshuflw(auVar41,auVar41,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x2d) = uVar5;
    *(undefined4 *)((long)ptr + 0x31) = uVar5;
    *(undefined4 *)((long)ptr + 0x35) = uVar5;
    *(undefined4 *)((long)ptr + 0x39) = uVar5;
    goto LAB_00569170;
  case 0x3e:
    auVar10._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar10[3] = uVar63;
    auVar10[2] = uVar63;
    auVar10[1] = uVar4;
    auVar10[0] = uVar4;
    auVar10._8_8_ = 0;
    auVar37 = pshuflw(auVar10,auVar10,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x2e) = uVar5;
    *(undefined4 *)((long)ptr + 0x32) = uVar5;
    *(undefined4 *)((long)ptr + 0x36) = uVar5;
    *(undefined4 *)((long)ptr + 0x3a) = uVar5;
    goto LAB_00569170;
  case 0x3f:
    auVar51._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar51[3] = uVar63;
    auVar51[2] = uVar63;
    auVar51[1] = uVar4;
    auVar51[0] = uVar4;
    auVar51._8_8_ = 0;
    auVar37 = pshuflw(auVar51,auVar51,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x2f) = uVar5;
    *(undefined4 *)((long)ptr + 0x33) = uVar5;
    *(undefined4 *)((long)ptr + 0x37) = uVar5;
    *(undefined4 *)((long)ptr + 0x3b) = uVar5;
    goto LAB_00569170;
  case 0x40:
    goto switchD_005681f0_caseD_40;
  case 0x41:
    *(undefined1 *)((long)ptr + 0x40) = uVar4;
    goto switchD_005681f0_caseD_40;
  case 0x42:
    *(ushort *)((long)ptr + 0x40) = uVar1 & 0xff | (ushort)(value << 8);
    goto switchD_005681f0_caseD_40;
  case 0x43:
    *(uint *)((long)ptr + 0x3f) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_40;
  case 0x44:
    *(uint *)((long)ptr + 0x40) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_40;
  case 0x45:
    *(ulong *)((long)ptr + 0x3d) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_40;
  case 0x46:
    *(ulong *)((long)ptr + 0x3e) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_40;
  case 0x47:
    *(ulong *)((long)ptr + 0x3f) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_40;
  case 0x48:
    *(ulong *)((long)ptr + 0x40) = (ulong)(value & 0xff) * 0x101010101010101;
switchD_005681f0_caseD_40:
    auVar52._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar52[3] = uVar63;
    auVar52[2] = uVar63;
    auVar52[1] = uVar4;
    auVar52[0] = uVar4;
    auVar52._8_8_ = 0;
    auVar37 = pshuflw(auVar52,auVar52,0);
    uVar5 = auVar37._0_4_;
LAB_0056916b:
    *(undefined4 *)((long)ptr + 0x30) = uVar5;
    *(undefined4 *)((long)ptr + 0x34) = uVar5;
    *(undefined4 *)((long)ptr + 0x38) = uVar5;
    *(undefined4 *)((long)ptr + 0x3c) = uVar5;
    goto LAB_00569170;
  case 0x49:
    auVar17._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar17[3] = uVar63;
    auVar17[2] = uVar63;
    auVar17[1] = uVar4;
    auVar17[0] = uVar4;
    auVar17._8_8_ = 0;
    auVar37 = pshuflw(auVar17,auVar17,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x39) = uVar5;
    *(undefined4 *)((long)ptr + 0x3d) = uVar5;
    *(undefined4 *)((long)ptr + 0x41) = uVar5;
    *(undefined4 *)((long)ptr + 0x45) = uVar5;
    goto LAB_0056916b;
  case 0x4a:
    auVar49._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar49[3] = uVar63;
    auVar49[2] = uVar63;
    auVar49[1] = uVar4;
    auVar49[0] = uVar4;
    auVar49._8_8_ = 0;
    auVar37 = pshuflw(auVar49,auVar49,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x3a) = uVar5;
    *(undefined4 *)((long)ptr + 0x3e) = uVar5;
    *(undefined4 *)((long)ptr + 0x42) = uVar5;
    *(undefined4 *)((long)ptr + 0x46) = uVar5;
    goto LAB_0056916b;
  case 0x4b:
    auVar12._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar12[3] = uVar63;
    auVar12[2] = uVar63;
    auVar12[1] = uVar4;
    auVar12[0] = uVar4;
    auVar12._8_8_ = 0;
    auVar37 = pshuflw(auVar12,auVar12,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x3b) = uVar5;
    *(undefined4 *)((long)ptr + 0x3f) = uVar5;
    *(undefined4 *)((long)ptr + 0x43) = uVar5;
    *(undefined4 *)((long)ptr + 0x47) = uVar5;
    goto LAB_0056916b;
  case 0x4c:
    auVar6._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value))
                        >> 0x20);
    auVar6[3] = uVar63;
    auVar6[2] = uVar63;
    auVar6[1] = uVar4;
    auVar6[0] = uVar4;
    auVar6._8_8_ = 0;
    auVar37 = pshuflw(auVar6,auVar6,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x3c) = uVar5;
    *(undefined4 *)((long)ptr + 0x40) = uVar5;
    *(undefined4 *)((long)ptr + 0x44) = uVar5;
    *(undefined4 *)((long)ptr + 0x48) = uVar5;
    goto LAB_0056916b;
  case 0x4d:
    auVar14._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar14[3] = uVar63;
    auVar14[2] = uVar63;
    auVar14[1] = uVar4;
    auVar14[0] = uVar4;
    auVar14._8_8_ = 0;
    auVar37 = pshuflw(auVar14,auVar14,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x3d) = uVar5;
    *(undefined4 *)((long)ptr + 0x41) = uVar5;
    *(undefined4 *)((long)ptr + 0x45) = uVar5;
    *(undefined4 *)((long)ptr + 0x49) = uVar5;
    goto LAB_0056916b;
  case 0x4e:
    auVar50._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar50[3] = uVar63;
    auVar50[2] = uVar63;
    auVar50[1] = uVar4;
    auVar50[0] = uVar4;
    auVar50._8_8_ = 0;
    auVar37 = pshuflw(auVar50,auVar50,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x3e) = uVar5;
    *(undefined4 *)((long)ptr + 0x42) = uVar5;
    *(undefined4 *)((long)ptr + 0x46) = uVar5;
    *(undefined4 *)((long)ptr + 0x4a) = uVar5;
    goto LAB_0056916b;
  case 0x4f:
    auVar22._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar22[3] = uVar63;
    auVar22[2] = uVar63;
    auVar22[1] = uVar4;
    auVar22[0] = uVar4;
    auVar22._8_8_ = 0;
    auVar37 = pshuflw(auVar22,auVar22,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x3f) = uVar5;
    *(undefined4 *)((long)ptr + 0x43) = uVar5;
    *(undefined4 *)((long)ptr + 0x47) = uVar5;
    *(undefined4 *)((long)ptr + 0x4b) = uVar5;
    goto LAB_0056916b;
  case 0x50:
    goto switchD_005681f0_caseD_50;
  case 0x51:
    *(undefined1 *)((long)ptr + 0x50) = uVar4;
    goto switchD_005681f0_caseD_50;
  case 0x52:
    *(ushort *)((long)ptr + 0x50) = uVar1 & 0xff | (ushort)(value << 8);
    goto switchD_005681f0_caseD_50;
  case 0x53:
    *(uint *)((long)ptr + 0x4f) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_50;
  case 0x54:
    *(uint *)((long)ptr + 0x50) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_50;
  case 0x55:
    *(ulong *)((long)ptr + 0x4d) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_50;
  case 0x56:
    *(ulong *)((long)ptr + 0x4e) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_50;
  case 0x57:
    *(ulong *)((long)ptr + 0x4f) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_50;
  case 0x58:
    *(ulong *)((long)ptr + 0x50) = (ulong)(value & 0xff) * 0x101010101010101;
switchD_005681f0_caseD_50:
    auVar45._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar45[3] = uVar63;
    auVar45[2] = uVar63;
    auVar45[1] = uVar4;
    auVar45[0] = uVar4;
    auVar45._8_8_ = 0;
    auVar37 = pshuflw(auVar45,auVar45,0);
    uVar5 = auVar37._0_4_;
LAB_00569166:
    *(undefined4 *)((long)ptr + 0x40) = uVar5;
    *(undefined4 *)((long)ptr + 0x44) = uVar5;
    *(undefined4 *)((long)ptr + 0x48) = uVar5;
    *(undefined4 *)((long)ptr + 0x4c) = uVar5;
    goto LAB_0056916b;
  case 0x59:
    auVar18._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar18[3] = uVar63;
    auVar18[2] = uVar63;
    auVar18[1] = uVar4;
    auVar18[0] = uVar4;
    auVar18._8_8_ = 0;
    auVar37 = pshuflw(auVar18,auVar18,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x49) = uVar5;
    *(undefined4 *)((long)ptr + 0x4d) = uVar5;
    *(undefined4 *)((long)ptr + 0x51) = uVar5;
    *(undefined4 *)((long)ptr + 0x55) = uVar5;
    goto LAB_00569166;
  case 0x5a:
    auVar9._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value))
                        >> 0x20);
    auVar9[3] = uVar63;
    auVar9[2] = uVar63;
    auVar9[1] = uVar4;
    auVar9[0] = uVar4;
    auVar9._8_8_ = 0;
    auVar37 = pshuflw(auVar9,auVar9,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x4a) = uVar5;
    *(undefined4 *)((long)ptr + 0x4e) = uVar5;
    *(undefined4 *)((long)ptr + 0x52) = uVar5;
    *(undefined4 *)((long)ptr + 0x56) = uVar5;
    goto LAB_00569166;
  case 0x5b:
    auVar58._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar58[3] = uVar63;
    auVar58[2] = uVar63;
    auVar58[1] = uVar4;
    auVar58[0] = uVar4;
    auVar58._8_8_ = 0;
    auVar37 = pshuflw(auVar58,auVar58,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x4b) = uVar5;
    *(undefined4 *)((long)ptr + 0x4f) = uVar5;
    *(undefined4 *)((long)ptr + 0x53) = uVar5;
    *(undefined4 *)((long)ptr + 0x57) = uVar5;
    goto LAB_00569166;
  case 0x5c:
    auVar55._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar55[3] = uVar63;
    auVar55[2] = uVar63;
    auVar55[1] = uVar4;
    auVar55[0] = uVar4;
    auVar55._8_8_ = 0;
    auVar37 = pshuflw(auVar55,auVar55,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x4c) = uVar5;
    *(undefined4 *)((long)ptr + 0x50) = uVar5;
    *(undefined4 *)((long)ptr + 0x54) = uVar5;
    *(undefined4 *)((long)ptr + 0x58) = uVar5;
    goto LAB_00569166;
  case 0x5d:
    auVar57._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar57[3] = uVar63;
    auVar57[2] = uVar63;
    auVar57[1] = uVar4;
    auVar57[0] = uVar4;
    auVar57._8_8_ = 0;
    auVar37 = pshuflw(auVar57,auVar57,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x4d) = uVar5;
    *(undefined4 *)((long)ptr + 0x51) = uVar5;
    *(undefined4 *)((long)ptr + 0x55) = uVar5;
    *(undefined4 *)((long)ptr + 0x59) = uVar5;
    goto LAB_00569166;
  case 0x5e:
    auVar46._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar46[3] = uVar63;
    auVar46[2] = uVar63;
    auVar46[1] = uVar4;
    auVar46[0] = uVar4;
    auVar46._8_8_ = 0;
    auVar37 = pshuflw(auVar46,auVar46,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x4e) = uVar5;
    *(undefined4 *)((long)ptr + 0x52) = uVar5;
    *(undefined4 *)((long)ptr + 0x56) = uVar5;
    *(undefined4 *)((long)ptr + 0x5a) = uVar5;
    goto LAB_00569166;
  case 0x5f:
    auVar25._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar25[3] = uVar63;
    auVar25[2] = uVar63;
    auVar25[1] = uVar4;
    auVar25[0] = uVar4;
    auVar25._8_8_ = 0;
    auVar37 = pshuflw(auVar25,auVar25,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x4f) = uVar5;
    *(undefined4 *)((long)ptr + 0x53) = uVar5;
    *(undefined4 *)((long)ptr + 0x57) = uVar5;
    *(undefined4 *)((long)ptr + 0x5b) = uVar5;
    goto LAB_00569166;
  case 0x60:
    goto switchD_005681f0_caseD_60;
  case 0x61:
    *(undefined1 *)((long)ptr + 0x60) = uVar4;
    goto switchD_005681f0_caseD_60;
  case 0x62:
    *(ushort *)((long)ptr + 0x60) = uVar1 & 0xff | (ushort)(value << 8);
    goto switchD_005681f0_caseD_60;
  case 99:
    *(uint *)((long)ptr + 0x5f) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_60;
  case 100:
    *(uint *)((long)ptr + 0x60) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_60;
  case 0x65:
    *(ulong *)((long)ptr + 0x5d) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_60;
  case 0x66:
    *(ulong *)((long)ptr + 0x5e) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_60;
  case 0x67:
    *(ulong *)((long)ptr + 0x5f) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_60;
  case 0x68:
    *(ulong *)((long)ptr + 0x60) = (ulong)(value & 0xff) * 0x101010101010101;
switchD_005681f0_caseD_60:
    auVar56._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar56[3] = uVar63;
    auVar56[2] = uVar63;
    auVar56[1] = uVar4;
    auVar56[0] = uVar4;
    auVar56._8_8_ = 0;
    auVar37 = pshuflw(auVar56,auVar56,0);
    uVar5 = auVar37._0_4_;
LAB_00569161:
    *(undefined4 *)((long)ptr + 0x50) = uVar5;
    *(undefined4 *)((long)ptr + 0x54) = uVar5;
    *(undefined4 *)((long)ptr + 0x58) = uVar5;
    *(undefined4 *)((long)ptr + 0x5c) = uVar5;
    goto LAB_00569166;
  case 0x69:
    auVar26._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar26[3] = uVar63;
    auVar26[2] = uVar63;
    auVar26[1] = uVar4;
    auVar26[0] = uVar4;
    auVar26._8_8_ = 0;
    auVar37 = pshuflw(auVar26,auVar26,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x59) = uVar5;
    *(undefined4 *)((long)ptr + 0x5d) = uVar5;
    *(undefined4 *)((long)ptr + 0x61) = uVar5;
    *(undefined4 *)((long)ptr + 0x65) = uVar5;
    goto LAB_00569161;
  case 0x6a:
    auVar33._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar33[3] = uVar63;
    auVar33[2] = uVar63;
    auVar33[1] = uVar4;
    auVar33[0] = uVar4;
    auVar33._8_8_ = 0;
    auVar37 = pshuflw(auVar33,auVar33,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x5a) = uVar5;
    *(undefined4 *)((long)ptr + 0x5e) = uVar5;
    *(undefined4 *)((long)ptr + 0x62) = uVar5;
    *(undefined4 *)((long)ptr + 0x66) = uVar5;
    goto LAB_00569161;
  case 0x6b:
    auVar15._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar15[3] = uVar63;
    auVar15[2] = uVar63;
    auVar15[1] = uVar4;
    auVar15[0] = uVar4;
    auVar15._8_8_ = 0;
    auVar37 = pshuflw(auVar15,auVar15,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x5b) = uVar5;
    *(undefined4 *)((long)ptr + 0x5f) = uVar5;
    *(undefined4 *)((long)ptr + 99) = uVar5;
    *(undefined4 *)((long)ptr + 0x67) = uVar5;
    goto LAB_00569161;
  case 0x6c:
    auVar27._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar27[3] = uVar63;
    auVar27[2] = uVar63;
    auVar27[1] = uVar4;
    auVar27[0] = uVar4;
    auVar27._8_8_ = 0;
    auVar37 = pshuflw(auVar27,auVar27,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x5c) = uVar5;
    *(undefined4 *)((long)ptr + 0x60) = uVar5;
    *(undefined4 *)((long)ptr + 100) = uVar5;
    *(undefined4 *)((long)ptr + 0x68) = uVar5;
    goto LAB_00569161;
  case 0x6d:
    auVar16._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar16[3] = uVar63;
    auVar16[2] = uVar63;
    auVar16[1] = uVar4;
    auVar16[0] = uVar4;
    auVar16._8_8_ = 0;
    auVar37 = pshuflw(auVar16,auVar16,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x5d) = uVar5;
    *(undefined4 *)((long)ptr + 0x61) = uVar5;
    *(undefined4 *)((long)ptr + 0x65) = uVar5;
    *(undefined4 *)((long)ptr + 0x69) = uVar5;
    goto LAB_00569161;
  case 0x6e:
    auVar43._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar43[3] = uVar63;
    auVar43[2] = uVar63;
    auVar43[1] = uVar4;
    auVar43[0] = uVar4;
    auVar43._8_8_ = 0;
    auVar37 = pshuflw(auVar43,auVar43,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x5e) = uVar5;
    *(undefined4 *)((long)ptr + 0x62) = uVar5;
    *(undefined4 *)((long)ptr + 0x66) = uVar5;
    *(undefined4 *)((long)ptr + 0x6a) = uVar5;
    goto LAB_00569161;
  case 0x6f:
    auVar38._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar38[3] = uVar63;
    auVar38[2] = uVar63;
    auVar38[1] = uVar4;
    auVar38[0] = uVar4;
    auVar38._8_8_ = 0;
    auVar37 = pshuflw(auVar38,auVar38,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x5f) = uVar5;
    *(undefined4 *)((long)ptr + 99) = uVar5;
    *(undefined4 *)((long)ptr + 0x67) = uVar5;
    *(undefined4 *)((long)ptr + 0x6b) = uVar5;
    goto LAB_00569161;
  case 0x70:
    goto switchD_005681f0_caseD_70;
  case 0x71:
    *(undefined1 *)((long)ptr + 0x70) = uVar4;
    goto switchD_005681f0_caseD_70;
  case 0x72:
    *(ushort *)((long)ptr + 0x70) = uVar1 & 0xff | (ushort)(value << 8);
    goto switchD_005681f0_caseD_70;
  case 0x73:
    *(uint *)((long)ptr + 0x6f) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_70;
  case 0x74:
    *(uint *)((long)ptr + 0x70) = (value & 0xffU) * 0x1010101;
    goto switchD_005681f0_caseD_70;
  case 0x75:
    *(ulong *)((long)ptr + 0x6d) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_70;
  case 0x76:
    *(ulong *)((long)ptr + 0x6e) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_70;
  case 0x77:
    *(ulong *)((long)ptr + 0x6f) = (ulong)(value & 0xff) * 0x101010101010101;
    goto switchD_005681f0_caseD_70;
  case 0x78:
    *(ulong *)((long)ptr + 0x70) = (ulong)(value & 0xff) * 0x101010101010101;
switchD_005681f0_caseD_70:
    auVar54._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar54[3] = uVar63;
    auVar54[2] = uVar63;
    auVar54[1] = uVar4;
    auVar54[0] = uVar4;
    auVar54._8_8_ = 0;
    auVar37 = pshuflw(auVar54,auVar54,0);
    uVar5 = auVar37._0_4_;
LAB_00569105:
    *(undefined4 *)((long)ptr + 0x60) = uVar5;
    *(undefined4 *)((long)ptr + 100) = uVar5;
    *(undefined4 *)((long)ptr + 0x68) = uVar5;
    *(undefined4 *)((long)ptr + 0x6c) = uVar5;
    goto LAB_00569161;
  case 0x79:
    auVar28._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar28[3] = uVar63;
    auVar28[2] = uVar63;
    auVar28[1] = uVar4;
    auVar28[0] = uVar4;
    auVar28._8_8_ = 0;
    auVar37 = pshuflw(auVar28,auVar28,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x69) = uVar5;
    *(undefined4 *)((long)ptr + 0x6d) = uVar5;
    *(undefined4 *)((long)ptr + 0x71) = uVar5;
    *(undefined4 *)((long)ptr + 0x75) = uVar5;
    goto LAB_00569105;
  case 0x7a:
    auVar40._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar40[3] = uVar63;
    auVar40[2] = uVar63;
    auVar40[1] = uVar4;
    auVar40[0] = uVar4;
    auVar40._8_8_ = 0;
    auVar37 = pshuflw(auVar40,auVar40,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x6a) = uVar5;
    *(undefined4 *)((long)ptr + 0x6e) = uVar5;
    *(undefined4 *)((long)ptr + 0x72) = uVar5;
    *(undefined4 *)((long)ptr + 0x76) = uVar5;
    goto LAB_00569105;
  case 0x7b:
    auVar48._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar48[3] = uVar63;
    auVar48[2] = uVar63;
    auVar48[1] = uVar4;
    auVar48[0] = uVar4;
    auVar48._8_8_ = 0;
    auVar37 = pshuflw(auVar48,auVar48,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x6b) = uVar5;
    *(undefined4 *)((long)ptr + 0x6f) = uVar5;
    *(undefined4 *)((long)ptr + 0x73) = uVar5;
    *(undefined4 *)((long)ptr + 0x77) = uVar5;
    goto LAB_00569105;
  case 0x7c:
    auVar13._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar13[3] = uVar63;
    auVar13[2] = uVar63;
    auVar13[1] = uVar4;
    auVar13[0] = uVar4;
    auVar13._8_8_ = 0;
    auVar37 = pshuflw(auVar13,auVar13,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x6c) = uVar5;
    *(undefined4 *)((long)ptr + 0x70) = uVar5;
    *(undefined4 *)((long)ptr + 0x74) = uVar5;
    *(undefined4 *)((long)ptr + 0x78) = uVar5;
    goto LAB_00569105;
  case 0x7d:
    auVar11._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar11[3] = uVar63;
    auVar11[2] = uVar63;
    auVar11[1] = uVar4;
    auVar11[0] = uVar4;
    auVar11._8_8_ = 0;
    auVar37 = pshuflw(auVar11,auVar11,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x6d) = uVar5;
    *(undefined4 *)((long)ptr + 0x71) = uVar5;
    *(undefined4 *)((long)ptr + 0x75) = uVar5;
    *(undefined4 *)((long)ptr + 0x79) = uVar5;
    goto LAB_00569105;
  case 0x7e:
    auVar29._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar29[3] = uVar63;
    auVar29[2] = uVar63;
    auVar29[1] = uVar4;
    auVar29[0] = uVar4;
    auVar29._8_8_ = 0;
    auVar37 = pshuflw(auVar29,auVar29,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x6e) = uVar5;
    *(undefined4 *)((long)ptr + 0x72) = uVar5;
    *(undefined4 *)((long)ptr + 0x76) = uVar5;
    *(undefined4 *)((long)ptr + 0x7a) = uVar5;
    goto LAB_00569105;
  case 0x7f:
    auVar30._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar30[3] = uVar63;
    auVar30[2] = uVar63;
    auVar30[1] = uVar4;
    auVar30[0] = uVar4;
    auVar30._8_8_ = 0;
    auVar37 = pshuflw(auVar30,auVar30,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x6f) = uVar5;
    *(undefined4 *)((long)ptr + 0x73) = uVar5;
    *(undefined4 *)((long)ptr + 0x77) = uVar5;
    *(undefined4 *)((long)ptr + 0x7b) = uVar5;
    goto LAB_00569105;
  case 0x80:
    auVar37._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
    auVar37[3] = uVar63;
    auVar37[2] = uVar63;
    auVar37[1] = uVar4;
    auVar37[0] = uVar4;
    auVar37._8_8_ = 0;
    auVar37 = pshuflw(auVar37,auVar37,0);
    uVar5 = auVar37._0_4_;
    *(undefined4 *)((long)ptr + 0x70) = uVar5;
    *(undefined4 *)((long)ptr + 0x74) = uVar5;
    *(undefined4 *)((long)ptr + 0x78) = uVar5;
    *(undefined4 *)((long)ptr + 0x7c) = uVar5;
    goto LAB_00569105;
  case 0x81:
    switchD_005681f0::default(ptr,value,0x81);
    return;
  case 0x82:
    switchD_005681f0::default(ptr,value,0x82);
    return;
  case 0x83:
    switchD_005681f0::default(ptr,value,0x83);
    return;
  case 0x84:
    switchD_005681f0::default(ptr,value,0x84);
    return;
  case 0x85:
    switchD_005681f0::default(ptr,value,0x85);
    return;
  case 0x86:
    switchD_005681f0::default(ptr,value,0x86);
    return;
  case 0x87:
    switchD_005681f0::default(ptr,value,0x87);
    return;
  case 0x88:
    switchD_005681f0::default(ptr,value,0x88);
    return;
  case 0x89:
    switchD_005681f0::default(ptr,value,0x89);
    return;
  case 0x8a:
    switchD_005681f0::default(ptr,value,0x8a);
    return;
  case 0x8b:
    switchD_005681f0::default(ptr,value,0x8b);
    return;
  case 0x8c:
    switchD_005681f0::default(ptr,value,0x8c);
    return;
  case 0x8d:
    switchD_005681f0::default(ptr,value,0x8d);
    return;
  case 0x8e:
    switchD_005681f0::default(ptr,value,0x8e);
    return;
  case 0x8f:
    switchD_005681f0::default(ptr,value,0x8f);
    return;
  case 0x90:
    switchD_005681f0::default(ptr,value,0x90);
    return;
  case 0x91:
    switchD_005681f0::default(ptr,value,0x91);
    return;
  case 0x92:
    switchD_005681f0::default(ptr,value,0x92);
    return;
  case 0x93:
    switchD_005681f0::default(ptr,value,0x93);
    return;
  case 0x94:
    switchD_005681f0::default(ptr,value,0x94);
    return;
  case 0x95:
    switchD_005681f0::default(ptr,value,0x95);
    return;
  case 0x96:
    switchD_005681f0::default(ptr,value,0x96);
    return;
  case 0x97:
    switchD_005681f0::default(ptr,value,0x97);
    return;
  case 0x98:
    switchD_005681f0::default(ptr,value,0x98);
    return;
  case 0x99:
    switchD_005681f0::default(ptr,value,0x99);
    return;
  case 0x9a:
    switchD_005681f0::default(ptr,value,0x9a);
    return;
  case 0x9b:
    switchD_005681f0::default(ptr,value,0x9b);
    return;
  case 0x9c:
    switchD_005681f0::default(ptr,value,0x9c);
    return;
  case 0x9d:
    switchD_005681f0::default(ptr,value,0x9d);
    return;
  case 0x9e:
    switchD_005681f0::default(ptr,value,0x9e);
    return;
  case 0x9f:
    switchD_005681f0::default(ptr,value,0x9f);
    return;
  case 0xa0:
    switchD_005681f0::default(ptr,value,0xa0);
    return;
  case 0xa1:
    switchD_005681f0::default(ptr,value,0xa1);
    return;
  case 0xa2:
    switchD_005681f0::default(ptr,value,0xa2);
    return;
  case 0xa3:
    switchD_005681f0::default(ptr,value,0xa3);
    return;
  case 0xa4:
    switchD_005681f0::default(ptr,value,0xa4);
    return;
  case 0xa5:
    switchD_005681f0::default(ptr,value,0xa5);
    return;
  case 0xa6:
    switchD_005681f0::default(ptr,value,0xa6);
    return;
  case 0xa7:
    switchD_005681f0::default(ptr,value,0xa7);
    return;
  case 0xa8:
    switchD_005681f0::default(ptr,value,0xa8);
    return;
  case 0xa9:
    switchD_005681f0::default(ptr,value,0xa9);
    return;
  case 0xaa:
    switchD_005681f0::default(ptr,value,0xaa);
    return;
  case 0xab:
    switchD_005681f0::default(ptr,value,0xab);
    return;
  case 0xac:
    switchD_005681f0::default(ptr,value,0xac);
    return;
  case 0xad:
    switchD_005681f0::default(ptr,value,0xad);
    return;
  case 0xae:
    switchD_005681f0::default(ptr,value,0xae);
    return;
  case 0xaf:
    switchD_005681f0::default(ptr,value,0xaf);
    return;
  case 0xb0:
    switchD_005681f0::default(ptr,value,0xb0);
    return;
  case 0xb1:
    switchD_005681f0::default(ptr,value,0xb1);
    return;
  case 0xb2:
    switchD_005681f0::default(ptr,value,0xb2);
    return;
  case 0xb3:
    switchD_005681f0::default(ptr,value,0xb3);
    return;
  case 0xb4:
    switchD_005681f0::default(ptr,value,0xb4);
    return;
  case 0xb5:
    switchD_005681f0::default(ptr,value,0xb5);
    return;
  case 0xb6:
    switchD_005681f0::default(ptr,value,0xb6);
    return;
  case 0xb7:
    switchD_005681f0::default(ptr,value,0xb7);
    return;
  case 0xb8:
    switchD_005681f0::default(ptr,value,0xb8);
    return;
  case 0xb9:
    switchD_005681f0::default(ptr,value,0xb9);
    return;
  case 0xba:
    switchD_005681f0::default(ptr,value,0xba);
    return;
  case 0xbb:
    switchD_005681f0::default(ptr,value,0xbb);
    return;
  case 0xbc:
    switchD_005681f0::default(ptr,value,0xbc);
    return;
  case 0xbd:
    switchD_005681f0::default(ptr,value,0xbd);
    return;
  case 0xbe:
    switchD_005681f0::default(ptr,value,0xbe);
    return;
  case 0xbf:
    switchD_005681f0::default(ptr,value,0xbf);
    return;
  case 0xc0:
    switchD_005681f0::default(ptr,value,0xc0);
    return;
  case 0xc1:
    switchD_005681f0::default(ptr,value,0xc1);
    return;
  case 0xc2:
    switchD_005681f0::default(ptr,value,0xc2);
    return;
  case 0xc3:
    switchD_005681f0::default(ptr,value,0xc3);
    return;
  case 0xc4:
    switchD_005681f0::default(ptr,value,0xc4);
    return;
  case 0xc5:
    switchD_005681f0::default(ptr,value,0xc5);
    return;
  case 0xc6:
    switchD_005681f0::default(ptr,value,0xc6);
    return;
  case 199:
    switchD_005681f0::default(ptr,value,199);
    return;
  case 200:
    switchD_005681f0::default(ptr,value,200);
    return;
  case 0xc9:
    switchD_005681f0::default(ptr,value,0xc9);
    return;
  case 0xca:
    switchD_005681f0::default(ptr,value,0xca);
    return;
  case 0xcb:
    switchD_005681f0::default(ptr,value,0xcb);
    return;
  case 0xcc:
    switchD_005681f0::default(ptr,value,0xcc);
    return;
  case 0xcd:
    switchD_005681f0::default(ptr,value,0xcd);
    return;
  case 0xce:
    switchD_005681f0::default(ptr,value,0xce);
    return;
  case 0xcf:
    switchD_005681f0::default(ptr,value,0xcf);
    return;
  case 0xd0:
    switchD_005681f0::default(ptr,value,0xd0);
    return;
  case 0xd1:
    switchD_005681f0::default(ptr,value,0xd1);
    return;
  case 0xd2:
    switchD_005681f0::default(ptr,value,0xd2);
    return;
  case 0xd3:
    switchD_005681f0::default(ptr,value,0xd3);
    return;
  case 0xd4:
    switchD_005681f0::default(ptr,value,0xd4);
    return;
  case 0xd5:
    switchD_005681f0::default(ptr,value,0xd5);
    return;
  case 0xd6:
    switchD_005681f0::default(ptr,value,0xd6);
    return;
  case 0xd7:
    switchD_005681f0::default(ptr,value,0xd7);
    return;
  case 0xd8:
    switchD_005681f0::default(ptr,value,0xd8);
    return;
  case 0xd9:
    switchD_005681f0::default(ptr,value,0xd9);
    return;
  case 0xda:
    switchD_005681f0::default(ptr,value,0xda);
    return;
  case 0xdb:
    switchD_005681f0::default(ptr,value,0xdb);
    return;
  case 0xdc:
    switchD_005681f0::default(ptr,value,0xdc);
    return;
  case 0xdd:
    switchD_005681f0::default(ptr,value,0xdd);
    return;
  case 0xde:
    switchD_005681f0::default(ptr,value,0xde);
    return;
  case 0xdf:
    switchD_005681f0::default(ptr,value,0xdf);
    return;
  case 0xe0:
    switchD_005681f0::default(ptr,value,0xe0);
    return;
  case 0xe1:
    switchD_005681f0::default(ptr,value,0xe1);
    return;
  case 0xe2:
    switchD_005681f0::default(ptr,value,0xe2);
    return;
  case 0xe3:
    switchD_005681f0::default(ptr,value,0xe3);
    return;
  case 0xe4:
    switchD_005681f0::default(ptr,value,0xe4);
    return;
  case 0xe5:
    switchD_005681f0::default(ptr,value,0xe5);
    return;
  case 0xe6:
    switchD_005681f0::default(ptr,value,0xe6);
    return;
  case 0xe7:
    switchD_005681f0::default(ptr,value,0xe7);
    return;
  case 0xe8:
    switchD_005681f0::default(ptr,value,0xe8);
    return;
  case 0xe9:
    switchD_005681f0::default(ptr,value,0xe9);
    return;
  case 0xea:
    switchD_005681f0::default(ptr,value,0xea);
    return;
  case 0xeb:
    switchD_005681f0::default(ptr,value,0xeb);
    return;
  case 0xec:
    switchD_005681f0::default(ptr,value,0xec);
    return;
  case 0xed:
    switchD_005681f0::default(ptr,value,0xed);
    return;
  case 0xee:
    switchD_005681f0::default(ptr,value,0xee);
    return;
  case 0xef:
    switchD_005681f0::default(ptr,value,0xef);
    return;
  case 0xf0:
    switchD_005681f0::default(ptr,value,0xf0);
    return;
  case 0xf1:
    switchD_005681f0::default(ptr,value,0xf1);
    return;
  case 0xf2:
    switchD_005681f0::default(ptr,value,0xf2);
    return;
  case 0xf3:
    switchD_005681f0::default(ptr,value,0xf3);
    return;
  case 0xf4:
    switchD_005681f0::default(ptr,value,0xf4);
    return;
  case 0xf5:
    switchD_005681f0::default(ptr,value,0xf5);
    return;
  case 0xf6:
    switchD_005681f0::default(ptr,value,0xf6);
    return;
  case 0xf7:
    switchD_005681f0::default(ptr,value,0xf7);
    return;
  case 0xf8:
    switchD_005681f0::default(ptr,value,0xf8);
    return;
  case 0xf9:
    switchD_005681f0::default(ptr,value,0xf9);
    return;
  case 0xfa:
    switchD_005681f0::default(ptr,value,0xfa);
    return;
  case 0xfb:
    switchD_005681f0::default(ptr,value,0xfb);
    return;
  case 0xfc:
    switchD_005681f0::default(ptr,value,0xfc);
    return;
  case 0xfd:
    switchD_005681f0::default(ptr,value,0xfd);
    return;
  case 0xfe:
    switchD_005681f0::default(ptr,value,0xfe);
    return;
  case 0xff:
    switchD_005681f0::default(ptr,value,0xff);
    return;
  case 0x100:
    switchD_005681f0::default(ptr,value,0x100);
    return;
  default:
    memset(ptr,value,size);
    return;
  }
  auVar62._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar65,uVar65),uVar64),CONCAT14(uVar64,value)) >> 0x20);
  auVar62[3] = uVar63;
  auVar62[2] = uVar63;
  auVar62[1] = uVar4;
  auVar62[0] = uVar4;
  auVar62._8_8_ = 0;
  auVar37 = pshuflw(auVar62,auVar62,0);
  uVar5 = auVar37._0_4_;
LAB_0056917a:
  *(undefined4 *)ptr = uVar5;
  *(undefined4 *)((long)ptr + 4) = uVar5;
  *(undefined4 *)((long)ptr + 8) = uVar5;
  *(undefined4 *)((long)ptr + 0xc) = uVar5;
  return;
}

Assistant:

inline void FastMemset(void *ptr, int value, size_t size) {
	// LCOV_EXCL_START
	switch (size) {
	case 0:
		return;
	case 1:
		return MemsetFixed<1>(ptr, value);
	case 2:
		return MemsetFixed<2>(ptr, value);
	case 3:
		return MemsetFixed<3>(ptr, value);
	case 4:
		return MemsetFixed<4>(ptr, value);
	case 5:
		return MemsetFixed<5>(ptr, value);
	case 6:
		return MemsetFixed<6>(ptr, value);
	case 7:
		return MemsetFixed<7>(ptr, value);
	case 8:
		return MemsetFixed<8>(ptr, value);
	case 9:
		return MemsetFixed<9>(ptr, value);
	case 10:
		return MemsetFixed<10>(ptr, value);
	case 11:
		return MemsetFixed<11>(ptr, value);
	case 12:
		return MemsetFixed<12>(ptr, value);
	case 13:
		return MemsetFixed<13>(ptr, value);
	case 14:
		return MemsetFixed<14>(ptr, value);
	case 15:
		return MemsetFixed<15>(ptr, value);
	case 16:
		return MemsetFixed<16>(ptr, value);
	case 17:
		return MemsetFixed<17>(ptr, value);
	case 18:
		return MemsetFixed<18>(ptr, value);
	case 19:
		return MemsetFixed<19>(ptr, value);
	case 20:
		return MemsetFixed<20>(ptr, value);
	case 21:
		return MemsetFixed<21>(ptr, value);
	case 22:
		return MemsetFixed<22>(ptr, value);
	case 23:
		return MemsetFixed<23>(ptr, value);
	case 24:
		return MemsetFixed<24>(ptr, value);
	case 25:
		return MemsetFixed<25>(ptr, value);
	case 26:
		return MemsetFixed<26>(ptr, value);
	case 27:
		return MemsetFixed<27>(ptr, value);
	case 28:
		return MemsetFixed<28>(ptr, value);
	case 29:
		return MemsetFixed<29>(ptr, value);
	case 30:
		return MemsetFixed<30>(ptr, value);
	case 31:
		return MemsetFixed<31>(ptr, value);
	case 32:
		return MemsetFixed<32>(ptr, value);
	case 33:
		return MemsetFixed<33>(ptr, value);
	case 34:
		return MemsetFixed<34>(ptr, value);
	case 35:
		return MemsetFixed<35>(ptr, value);
	case 36:
		return MemsetFixed<36>(ptr, value);
	case 37:
		return MemsetFixed<37>(ptr, value);
	case 38:
		return MemsetFixed<38>(ptr, value);
	case 39:
		return MemsetFixed<39>(ptr, value);
	case 40:
		return MemsetFixed<40>(ptr, value);
	case 41:
		return MemsetFixed<41>(ptr, value);
	case 42:
		return MemsetFixed<42>(ptr, value);
	case 43:
		return MemsetFixed<43>(ptr, value);
	case 44:
		return MemsetFixed<44>(ptr, value);
	case 45:
		return MemsetFixed<45>(ptr, value);
	case 46:
		return MemsetFixed<46>(ptr, value);
	case 47:
		return MemsetFixed<47>(ptr, value);
	case 48:
		return MemsetFixed<48>(ptr, value);
	case 49:
		return MemsetFixed<49>(ptr, value);
	case 50:
		return MemsetFixed<50>(ptr, value);
	case 51:
		return MemsetFixed<51>(ptr, value);
	case 52:
		return MemsetFixed<52>(ptr, value);
	case 53:
		return MemsetFixed<53>(ptr, value);
	case 54:
		return MemsetFixed<54>(ptr, value);
	case 55:
		return MemsetFixed<55>(ptr, value);
	case 56:
		return MemsetFixed<56>(ptr, value);
	case 57:
		return MemsetFixed<57>(ptr, value);
	case 58:
		return MemsetFixed<58>(ptr, value);
	case 59:
		return MemsetFixed<59>(ptr, value);
	case 60:
		return MemsetFixed<60>(ptr, value);
	case 61:
		return MemsetFixed<61>(ptr, value);
	case 62:
		return MemsetFixed<62>(ptr, value);
	case 63:
		return MemsetFixed<63>(ptr, value);
	case 64:
		return MemsetFixed<64>(ptr, value);
	case 65:
		return MemsetFixed<65>(ptr, value);
	case 66:
		return MemsetFixed<66>(ptr, value);
	case 67:
		return MemsetFixed<67>(ptr, value);
	case 68:
		return MemsetFixed<68>(ptr, value);
	case 69:
		return MemsetFixed<69>(ptr, value);
	case 70:
		return MemsetFixed<70>(ptr, value);
	case 71:
		return MemsetFixed<71>(ptr, value);
	case 72:
		return MemsetFixed<72>(ptr, value);
	case 73:
		return MemsetFixed<73>(ptr, value);
	case 74:
		return MemsetFixed<74>(ptr, value);
	case 75:
		return MemsetFixed<75>(ptr, value);
	case 76:
		return MemsetFixed<76>(ptr, value);
	case 77:
		return MemsetFixed<77>(ptr, value);
	case 78:
		return MemsetFixed<78>(ptr, value);
	case 79:
		return MemsetFixed<79>(ptr, value);
	case 80:
		return MemsetFixed<80>(ptr, value);
	case 81:
		return MemsetFixed<81>(ptr, value);
	case 82:
		return MemsetFixed<82>(ptr, value);
	case 83:
		return MemsetFixed<83>(ptr, value);
	case 84:
		return MemsetFixed<84>(ptr, value);
	case 85:
		return MemsetFixed<85>(ptr, value);
	case 86:
		return MemsetFixed<86>(ptr, value);
	case 87:
		return MemsetFixed<87>(ptr, value);
	case 88:
		return MemsetFixed<88>(ptr, value);
	case 89:
		return MemsetFixed<89>(ptr, value);
	case 90:
		return MemsetFixed<90>(ptr, value);
	case 91:
		return MemsetFixed<91>(ptr, value);
	case 92:
		return MemsetFixed<92>(ptr, value);
	case 93:
		return MemsetFixed<93>(ptr, value);
	case 94:
		return MemsetFixed<94>(ptr, value);
	case 95:
		return MemsetFixed<95>(ptr, value);
	case 96:
		return MemsetFixed<96>(ptr, value);
	case 97:
		return MemsetFixed<97>(ptr, value);
	case 98:
		return MemsetFixed<98>(ptr, value);
	case 99:
		return MemsetFixed<99>(ptr, value);
	case 100:
		return MemsetFixed<100>(ptr, value);
	case 101:
		return MemsetFixed<101>(ptr, value);
	case 102:
		return MemsetFixed<102>(ptr, value);
	case 103:
		return MemsetFixed<103>(ptr, value);
	case 104:
		return MemsetFixed<104>(ptr, value);
	case 105:
		return MemsetFixed<105>(ptr, value);
	case 106:
		return MemsetFixed<106>(ptr, value);
	case 107:
		return MemsetFixed<107>(ptr, value);
	case 108:
		return MemsetFixed<108>(ptr, value);
	case 109:
		return MemsetFixed<109>(ptr, value);
	case 110:
		return MemsetFixed<110>(ptr, value);
	case 111:
		return MemsetFixed<111>(ptr, value);
	case 112:
		return MemsetFixed<112>(ptr, value);
	case 113:
		return MemsetFixed<113>(ptr, value);
	case 114:
		return MemsetFixed<114>(ptr, value);
	case 115:
		return MemsetFixed<115>(ptr, value);
	case 116:
		return MemsetFixed<116>(ptr, value);
	case 117:
		return MemsetFixed<117>(ptr, value);
	case 118:
		return MemsetFixed<118>(ptr, value);
	case 119:
		return MemsetFixed<119>(ptr, value);
	case 120:
		return MemsetFixed<120>(ptr, value);
	case 121:
		return MemsetFixed<121>(ptr, value);
	case 122:
		return MemsetFixed<122>(ptr, value);
	case 123:
		return MemsetFixed<123>(ptr, value);
	case 124:
		return MemsetFixed<124>(ptr, value);
	case 125:
		return MemsetFixed<125>(ptr, value);
	case 126:
		return MemsetFixed<126>(ptr, value);
	case 127:
		return MemsetFixed<127>(ptr, value);
	case 128:
		return MemsetFixed<128>(ptr, value);
	case 129:
		return MemsetFixed<129>(ptr, value);
	case 130:
		return MemsetFixed<130>(ptr, value);
	case 131:
		return MemsetFixed<131>(ptr, value);
	case 132:
		return MemsetFixed<132>(ptr, value);
	case 133:
		return MemsetFixed<133>(ptr, value);
	case 134:
		return MemsetFixed<134>(ptr, value);
	case 135:
		return MemsetFixed<135>(ptr, value);
	case 136:
		return MemsetFixed<136>(ptr, value);
	case 137:
		return MemsetFixed<137>(ptr, value);
	case 138:
		return MemsetFixed<138>(ptr, value);
	case 139:
		return MemsetFixed<139>(ptr, value);
	case 140:
		return MemsetFixed<140>(ptr, value);
	case 141:
		return MemsetFixed<141>(ptr, value);
	case 142:
		return MemsetFixed<142>(ptr, value);
	case 143:
		return MemsetFixed<143>(ptr, value);
	case 144:
		return MemsetFixed<144>(ptr, value);
	case 145:
		return MemsetFixed<145>(ptr, value);
	case 146:
		return MemsetFixed<146>(ptr, value);
	case 147:
		return MemsetFixed<147>(ptr, value);
	case 148:
		return MemsetFixed<148>(ptr, value);
	case 149:
		return MemsetFixed<149>(ptr, value);
	case 150:
		return MemsetFixed<150>(ptr, value);
	case 151:
		return MemsetFixed<151>(ptr, value);
	case 152:
		return MemsetFixed<152>(ptr, value);
	case 153:
		return MemsetFixed<153>(ptr, value);
	case 154:
		return MemsetFixed<154>(ptr, value);
	case 155:
		return MemsetFixed<155>(ptr, value);
	case 156:
		return MemsetFixed<156>(ptr, value);
	case 157:
		return MemsetFixed<157>(ptr, value);
	case 158:
		return MemsetFixed<158>(ptr, value);
	case 159:
		return MemsetFixed<159>(ptr, value);
	case 160:
		return MemsetFixed<160>(ptr, value);
	case 161:
		return MemsetFixed<161>(ptr, value);
	case 162:
		return MemsetFixed<162>(ptr, value);
	case 163:
		return MemsetFixed<163>(ptr, value);
	case 164:
		return MemsetFixed<164>(ptr, value);
	case 165:
		return MemsetFixed<165>(ptr, value);
	case 166:
		return MemsetFixed<166>(ptr, value);
	case 167:
		return MemsetFixed<167>(ptr, value);
	case 168:
		return MemsetFixed<168>(ptr, value);
	case 169:
		return MemsetFixed<169>(ptr, value);
	case 170:
		return MemsetFixed<170>(ptr, value);
	case 171:
		return MemsetFixed<171>(ptr, value);
	case 172:
		return MemsetFixed<172>(ptr, value);
	case 173:
		return MemsetFixed<173>(ptr, value);
	case 174:
		return MemsetFixed<174>(ptr, value);
	case 175:
		return MemsetFixed<175>(ptr, value);
	case 176:
		return MemsetFixed<176>(ptr, value);
	case 177:
		return MemsetFixed<177>(ptr, value);
	case 178:
		return MemsetFixed<178>(ptr, value);
	case 179:
		return MemsetFixed<179>(ptr, value);
	case 180:
		return MemsetFixed<180>(ptr, value);
	case 181:
		return MemsetFixed<181>(ptr, value);
	case 182:
		return MemsetFixed<182>(ptr, value);
	case 183:
		return MemsetFixed<183>(ptr, value);
	case 184:
		return MemsetFixed<184>(ptr, value);
	case 185:
		return MemsetFixed<185>(ptr, value);
	case 186:
		return MemsetFixed<186>(ptr, value);
	case 187:
		return MemsetFixed<187>(ptr, value);
	case 188:
		return MemsetFixed<188>(ptr, value);
	case 189:
		return MemsetFixed<189>(ptr, value);
	case 190:
		return MemsetFixed<190>(ptr, value);
	case 191:
		return MemsetFixed<191>(ptr, value);
	case 192:
		return MemsetFixed<192>(ptr, value);
	case 193:
		return MemsetFixed<193>(ptr, value);
	case 194:
		return MemsetFixed<194>(ptr, value);
	case 195:
		return MemsetFixed<195>(ptr, value);
	case 196:
		return MemsetFixed<196>(ptr, value);
	case 197:
		return MemsetFixed<197>(ptr, value);
	case 198:
		return MemsetFixed<198>(ptr, value);
	case 199:
		return MemsetFixed<199>(ptr, value);
	case 200:
		return MemsetFixed<200>(ptr, value);
	case 201:
		return MemsetFixed<201>(ptr, value);
	case 202:
		return MemsetFixed<202>(ptr, value);
	case 203:
		return MemsetFixed<203>(ptr, value);
	case 204:
		return MemsetFixed<204>(ptr, value);
	case 205:
		return MemsetFixed<205>(ptr, value);
	case 206:
		return MemsetFixed<206>(ptr, value);
	case 207:
		return MemsetFixed<207>(ptr, value);
	case 208:
		return MemsetFixed<208>(ptr, value);
	case 209:
		return MemsetFixed<209>(ptr, value);
	case 210:
		return MemsetFixed<210>(ptr, value);
	case 211:
		return MemsetFixed<211>(ptr, value);
	case 212:
		return MemsetFixed<212>(ptr, value);
	case 213:
		return MemsetFixed<213>(ptr, value);
	case 214:
		return MemsetFixed<214>(ptr, value);
	case 215:
		return MemsetFixed<215>(ptr, value);
	case 216:
		return MemsetFixed<216>(ptr, value);
	case 217:
		return MemsetFixed<217>(ptr, value);
	case 218:
		return MemsetFixed<218>(ptr, value);
	case 219:
		return MemsetFixed<219>(ptr, value);
	case 220:
		return MemsetFixed<220>(ptr, value);
	case 221:
		return MemsetFixed<221>(ptr, value);
	case 222:
		return MemsetFixed<222>(ptr, value);
	case 223:
		return MemsetFixed<223>(ptr, value);
	case 224:
		return MemsetFixed<224>(ptr, value);
	case 225:
		return MemsetFixed<225>(ptr, value);
	case 226:
		return MemsetFixed<226>(ptr, value);
	case 227:
		return MemsetFixed<227>(ptr, value);
	case 228:
		return MemsetFixed<228>(ptr, value);
	case 229:
		return MemsetFixed<229>(ptr, value);
	case 230:
		return MemsetFixed<230>(ptr, value);
	case 231:
		return MemsetFixed<231>(ptr, value);
	case 232:
		return MemsetFixed<232>(ptr, value);
	case 233:
		return MemsetFixed<233>(ptr, value);
	case 234:
		return MemsetFixed<234>(ptr, value);
	case 235:
		return MemsetFixed<235>(ptr, value);
	case 236:
		return MemsetFixed<236>(ptr, value);
	case 237:
		return MemsetFixed<237>(ptr, value);
	case 238:
		return MemsetFixed<238>(ptr, value);
	case 239:
		return MemsetFixed<239>(ptr, value);
	case 240:
		return MemsetFixed<240>(ptr, value);
	case 241:
		return MemsetFixed<241>(ptr, value);
	case 242:
		return MemsetFixed<242>(ptr, value);
	case 243:
		return MemsetFixed<243>(ptr, value);
	case 244:
		return MemsetFixed<244>(ptr, value);
	case 245:
		return MemsetFixed<245>(ptr, value);
	case 246:
		return MemsetFixed<246>(ptr, value);
	case 247:
		return MemsetFixed<247>(ptr, value);
	case 248:
		return MemsetFixed<248>(ptr, value);
	case 249:
		return MemsetFixed<249>(ptr, value);
	case 250:
		return MemsetFixed<250>(ptr, value);
	case 251:
		return MemsetFixed<251>(ptr, value);
	case 252:
		return MemsetFixed<252>(ptr, value);
	case 253:
		return MemsetFixed<253>(ptr, value);
	case 254:
		return MemsetFixed<254>(ptr, value);
	case 255:
		return MemsetFixed<255>(ptr, value);
	case 256:
		return MemsetFixed<256>(ptr, value);
	default:
		memset(ptr, value, size);
	}
	// LCOV_EXCL_STOP
}